

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compatibility_tests.cpp
# Opt level: O1

void __thiscall
iu_Compatibility_x_iutest_x_TestPartResult_Test::Body
          (iu_Compatibility_x_iutest_x_TestPartResult_Test *this)

{
  return;
}

Assistant:

IUTEST(Compatibility, TestPartResult)
{
    (void)&::iutest::TestPartResult::type;
    (void)&::iutest::TestPartResult::file_name;
    (void)&::iutest::TestPartResult::line_number;
    (void)&::iutest::TestPartResult::summary;
    (void)&::iutest::TestPartResult::message;
    (void)&::iutest::TestPartResult::passed;
    (void)&::iutest::TestPartResult::failed;
    (void)&::iutest::TestPartResult::nonfatally_failed;
    (void)&::iutest::TestPartResult::fatally_failed;
}